

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_mutex_trylock(uv_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mutex);
  if (iVar1 != 0) {
    if ((iVar1 != 0xb) && (iVar1 != 0x10)) {
      abort();
    }
    iVar1 = -0x10;
  }
  return iVar1;
}

Assistant:

int uv_mutex_trylock(uv_mutex_t* mutex) {
  int err;

  err = pthread_mutex_trylock(mutex);
  if (err) {
    if (err != EBUSY && err != EAGAIN)
      abort();
    return UV_EBUSY;
  }

  return 0;
}